

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O3

SBuf * lj_buf_putstr_rep(SBuf *sb,GCstr *s,int32_t rep)

{
  uint uVar1;
  bool bVar2;
  GCstr *pGVar3;
  GCstr *pGVar4;
  ulong uVar5;
  char *__s;
  ulong __n;
  GCstr *pGVar6;
  
  uVar1 = s->len;
  if (uVar1 == 0 || rep < 1) {
    return sb;
  }
  __n = (ulong)(uint)rep;
  uVar5 = __n * uVar1;
  if (uVar5 < 0x7fffff01) {
    __s = sb->w;
    if ((uint)uVar5 <= (uint)(*(int *)&sb->e - (int)__s)) goto LAB_001104c0;
  }
  else {
    lj_buf_putstr_rep_cold_1();
  }
  __s = lj_buf_more2(sb,(MSize)uVar5);
LAB_001104c0:
  pGVar6 = s + 1;
  if (uVar1 == 1) {
    memset(__s,(uint)(byte)(pGVar6->nextgc).gcptr64,__n);
    __s = __s + __n;
  }
  else {
    pGVar3 = pGVar6;
    do {
      do {
        pGVar4 = (GCstr *)((long)&(pGVar3->nextgc).gcptr64 + 1);
        *__s = (char)(pGVar3->nextgc).gcptr64;
        __s = __s + 1;
        pGVar3 = pGVar4;
      } while (pGVar4 < (GCstr *)((long)&(pGVar6->nextgc).gcptr64 + (ulong)uVar1));
      bVar2 = 1 < rep;
      pGVar3 = pGVar6;
      rep = rep + -1;
    } while (bVar2);
  }
  sb->w = __s;
  return sb;
}

Assistant:

SBuf *lj_buf_putstr_rep(SBuf *sb, GCstr *s, int32_t rep)
{
  MSize len = s->len;
  if (rep > 0 && len) {
    uint64_t tlen = (uint64_t)rep * len;
    char *w;
    if (LJ_UNLIKELY(tlen > LJ_MAX_STR))
      lj_err_mem(sbufL(sb));
    w = lj_buf_more(sb, (MSize)tlen);
    if (len == 1) {  /* Optimize a common case. */
      uint32_t c = strdata(s)[0];
      do { *w++ = c; } while (--rep > 0);
    } else {
      const char *e = strdata(s) + len;
      do {
	const char *q = strdata(s);
	do { *w++ = *q++; } while (q < e);
      } while (--rep > 0);
    }
    sb->w = w;
  }
  return sb;
}